

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.cpp
# Opt level: O2

void RandAddEvent(uint32_t event_info)

{
  long lVar1;
  undefined8 uVar2;
  RNGState *pRVar3;
  long in_FS_OFFSET;
  undefined4 local_30;
  uint32_t local_2c;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pRVar3 = anon_unknown.dwarf_4171f6c::GetRNGState();
  local_2c = event_info;
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            (&criticalblock0,&pRVar3->m_events_mutex,"m_events_mutex",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/random.cpp",
             0x1be,false);
  CSHA256::Write(&pRVar3->m_events_hasher,(uchar *)&local_2c,4);
  uVar2 = rdtsc();
  local_30 = (undefined4)uVar2;
  CSHA256::Write(&pRVar3->m_events_hasher,(uchar *)&local_30,4);
  std::unique_lock<std::mutex>::~unique_lock(&criticalblock0.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void RandAddEvent(const uint32_t event_info) noexcept { GetRNGState().AddEvent(event_info); }